

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::BVHNIntersector1<4,_16777232,_true,_embree::avx::SubdivPatch1MBIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  Geometry *pGVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [24];
  undefined4 uVar60;
  int iVar61;
  AABBNodeMB4D *node1;
  ulong uVar62;
  uint uVar63;
  ulong uVar64;
  long lVar65;
  Primitive *prim;
  long lVar66;
  ulong uVar67;
  undefined1 (*pauVar68) [16];
  ulong uVar69;
  long lVar70;
  ulong uVar71;
  undefined1 (*pauVar72) [16];
  ulong uVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar80 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar110;
  float fVar111;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar108 [32];
  float fVar112;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar109 [32];
  float fVar119;
  float fVar125;
  float fVar126;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar127;
  undefined1 auVar124 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar139 [64];
  float fVar146;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar149 [64];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  float fVar160;
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  float fVar161;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar166 [64];
  float fVar173;
  undefined1 auVar174 [32];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar175 [64];
  float fVar182;
  float fVar183;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar192;
  float fVar198;
  undefined1 auVar189 [32];
  float fVar191;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar190 [64];
  float fVar205;
  undefined1 auVar200 [16];
  float fVar199;
  undefined1 auVar201 [32];
  float fVar203;
  float fVar204;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar202 [64];
  float fVar209;
  undefined1 auVar210 [32];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar211 [64];
  float fVar218;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar222 [64];
  float fVar229;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar232 [64];
  float fVar239;
  undefined1 auVar240 [32];
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar241 [64];
  MapUV<embree::avx::GridSOA::Gather3x3> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_ce4;
  undefined1 local_ce0 [8];
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  ulong *local_cb0;
  long local_ca8;
  undefined1 local_ca0 [8];
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  undefined1 local_c80 [8];
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined1 local_c60 [16];
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 (*local_c18) [16];
  ulong local_c10;
  ulong local_c08;
  undefined8 local_c00;
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  undefined1 local_be0 [8];
  undefined1 auStack_bd8 [8];
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  undefined1 local_bc0 [32];
  long local_b90;
  long local_b88;
  undefined4 local_b80;
  undefined4 local_b7c;
  undefined4 local_b78;
  float local_b74;
  float local_b70;
  undefined4 local_b6c;
  undefined4 local_b68;
  uint local_b64;
  uint local_b60;
  int *local_b50;
  undefined8 local_b48;
  RTCRayQueryContext *local_b40;
  Ray *local_b38;
  undefined4 *local_b30;
  undefined4 local_b28;
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [48];
  undefined1 local_a50 [16];
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined1 local_920 [32];
  undefined1 (**local_900) [16];
  undefined1 local_8e0 [32];
  float local_8c0 [4];
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  ulong local_800 [250];
  undefined1 auVar184 [16];
  undefined1 auVar185 [24];
  undefined1 auVar188 [32];
  
  local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800[0] != 8) {
    fVar74 = ray->tfar;
    auVar149 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar74) {
      local_cb0 = local_800 + 1;
      auVar156 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar4 = (ray->dir).field_0;
      auVar89._8_4_ = 0x7fffffff;
      auVar89._0_8_ = 0x7fffffff7fffffff;
      auVar89._12_4_ = 0x7fffffff;
      auVar89 = vandps_avx((undefined1  [16])aVar4,auVar89);
      auVar124._8_4_ = 0x219392ef;
      auVar124._0_8_ = 0x219392ef219392ef;
      auVar124._12_4_ = 0x219392ef;
      auVar89 = vcmpps_avx(auVar89,auVar124,1);
      auVar120._8_4_ = 0x3f800000;
      auVar120._0_8_ = 0x3f8000003f800000;
      auVar120._12_4_ = 0x3f800000;
      auVar124 = vdivps_avx(auVar120,(undefined1  [16])aVar4);
      auVar121._8_4_ = 0x5d5e0b6b;
      auVar121._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar121._12_4_ = 0x5d5e0b6b;
      auVar89 = vblendvps_avx(auVar124,auVar121,auVar89);
      auVar200._0_4_ = auVar89._0_4_ * 0.99999964;
      auVar200._4_4_ = auVar89._4_4_ * 0.99999964;
      auVar200._8_4_ = auVar89._8_4_ * 0.99999964;
      auVar200._12_4_ = auVar89._12_4_ * 0.99999964;
      auVar94._0_4_ = auVar89._0_4_ * 1.0000004;
      auVar94._4_4_ = auVar89._4_4_ * 1.0000004;
      auVar94._8_4_ = auVar89._8_4_ * 1.0000004;
      auVar94._12_4_ = auVar89._12_4_ * 1.0000004;
      uVar60 = *(undefined4 *)&(ray->org).field_0;
      local_ad0._4_4_ = uVar60;
      local_ad0._0_4_ = uVar60;
      local_ad0._8_4_ = uVar60;
      local_ad0._12_4_ = uVar60;
      auVar159 = ZEXT1664(local_ad0);
      uVar60 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_ae0._4_4_ = uVar60;
      local_ae0._0_4_ = uVar60;
      local_ae0._8_4_ = uVar60;
      local_ae0._12_4_ = uVar60;
      auVar166 = ZEXT1664(local_ae0);
      uVar60 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_af0._4_4_ = uVar60;
      local_af0._0_4_ = uVar60;
      local_af0._8_4_ = uVar60;
      local_af0._12_4_ = uVar60;
      auVar175 = ZEXT1664(local_af0);
      local_b00 = vshufps_avx(auVar200,auVar200,0);
      auVar190 = ZEXT1664(local_b00);
      auVar89 = vmovshdup_avx(auVar200);
      local_b10 = vshufps_avx(auVar200,auVar200,0x55);
      auVar202 = ZEXT1664(local_b10);
      auVar124 = vshufpd_avx(auVar200,auVar200,1);
      local_c30 = vshufps_avx(auVar200,auVar200,0xaa);
      auVar211 = ZEXT1664(local_c30);
      local_c40 = vshufps_avx(auVar94,auVar94,0);
      auVar222 = ZEXT1664(local_c40);
      local_c50 = vshufps_avx(auVar94,auVar94,0x55);
      auVar232 = ZEXT1664(local_c50);
      uVar69 = (ulong)(auVar200._0_4_ < 0.0) * 0x10;
      local_c60 = vshufps_avx(auVar94,auVar94,0xaa);
      auVar241 = ZEXT1664(local_c60);
      uVar71 = (ulong)(auVar89._0_4_ < 0.0) << 4 | 0x20;
      uVar73 = (ulong)(auVar124._0_4_ < 0.0) << 4 | 0x40;
      local_b20 = vshufps_avx(auVar156,auVar156,0);
      auVar139 = ZEXT1664(local_b20);
      iVar61 = 0x2223f80;
      local_a40 = mm_lookupmask_pd._0_8_;
      uStack_a38 = mm_lookupmask_pd._8_8_;
      uStack_a30 = mm_lookupmask_pd._0_8_;
      uStack_a28 = mm_lookupmask_pd._8_8_;
      local_a50 = vshufps_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74),0);
      auVar80 = ZEXT1664(local_a50);
      local_ca8 = 0;
LAB_00b8221b:
      local_b88 = (long)iVar61;
      local_b90 = local_ca8 + 0x30;
      auVar89 = vshufps_avx(auVar80._0_16_,auVar80._0_16_,0);
      register0x00001250 = auVar89;
      _local_9e0 = auVar89;
      auVar89 = ZEXT416((uint)(1.0 - auVar80._0_4_));
      auVar89 = vshufps_avx(auVar89,auVar89,0);
      register0x00001210 = auVar89;
      _local_a00 = auVar89;
LAB_00b82262:
      do {
        if (local_cb0 == local_800) {
          return;
        }
        uVar67 = local_cb0[-1];
        local_cb0 = local_cb0 + -1;
LAB_00b82273:
        fVar74 = (ray->dir).field_0.m128[3];
        auVar156._4_4_ = fVar74;
        auVar156._0_4_ = fVar74;
        auVar156._8_4_ = fVar74;
        auVar156._12_4_ = fVar74;
        while ((uVar67 & 8) == 0) {
          uVar62 = uVar67 & 0xfffffffffffffff0;
          pfVar2 = (float *)(uVar62 + 0x80 + uVar69);
          pfVar1 = (float *)(uVar62 + 0x20 + uVar69);
          auVar87._0_4_ = fVar74 * *pfVar2 + *pfVar1;
          auVar87._4_4_ = fVar74 * pfVar2[1] + pfVar1[1];
          auVar87._8_4_ = fVar74 * pfVar2[2] + pfVar1[2];
          auVar87._12_4_ = fVar74 * pfVar2[3] + pfVar1[3];
          auVar89 = vsubps_avx(auVar87,auVar159._0_16_);
          auVar88._0_4_ = auVar190._0_4_ * auVar89._0_4_;
          auVar88._4_4_ = auVar190._4_4_ * auVar89._4_4_;
          auVar88._8_4_ = auVar190._8_4_ * auVar89._8_4_;
          auVar88._12_4_ = auVar190._12_4_ * auVar89._12_4_;
          auVar89 = vmaxps_avx(auVar139._0_16_,auVar88);
          pfVar2 = (float *)(uVar62 + 0x80 + uVar71);
          pfVar1 = (float *)(uVar62 + 0x20 + uVar71);
          auVar95._0_4_ = fVar74 * *pfVar2 + *pfVar1;
          auVar95._4_4_ = fVar74 * pfVar2[1] + pfVar1[1];
          auVar95._8_4_ = fVar74 * pfVar2[2] + pfVar1[2];
          auVar95._12_4_ = fVar74 * pfVar2[3] + pfVar1[3];
          auVar124 = vsubps_avx(auVar95,auVar166._0_16_);
          auVar96._0_4_ = auVar202._0_4_ * auVar124._0_4_;
          auVar96._4_4_ = auVar202._4_4_ * auVar124._4_4_;
          auVar96._8_4_ = auVar202._8_4_ * auVar124._8_4_;
          auVar96._12_4_ = auVar202._12_4_ * auVar124._12_4_;
          pfVar2 = (float *)(uVar62 + 0x80 + uVar73);
          pfVar1 = (float *)(uVar62 + 0x20 + uVar73);
          auVar104._0_4_ = fVar74 * *pfVar2 + *pfVar1;
          auVar104._4_4_ = fVar74 * pfVar2[1] + pfVar1[1];
          auVar104._8_4_ = fVar74 * pfVar2[2] + pfVar1[2];
          auVar104._12_4_ = fVar74 * pfVar2[3] + pfVar1[3];
          auVar124 = vsubps_avx(auVar104,auVar175._0_16_);
          auVar105._0_4_ = auVar211._0_4_ * auVar124._0_4_;
          auVar105._4_4_ = auVar211._4_4_ * auVar124._4_4_;
          auVar105._8_4_ = auVar211._8_4_ * auVar124._8_4_;
          auVar105._12_4_ = auVar211._12_4_ * auVar124._12_4_;
          auVar124 = vmaxps_avx(auVar96,auVar105);
          auVar89 = vmaxps_avx(auVar89,auVar124);
          pfVar2 = (float *)(uVar62 + 0x80 + (uVar69 ^ 0x10));
          pfVar1 = (float *)(uVar62 + 0x20 + (uVar69 ^ 0x10));
          auVar97._0_4_ = fVar74 * *pfVar2 + *pfVar1;
          auVar97._4_4_ = fVar74 * pfVar2[1] + pfVar1[1];
          auVar97._8_4_ = fVar74 * pfVar2[2] + pfVar1[2];
          auVar97._12_4_ = fVar74 * pfVar2[3] + pfVar1[3];
          auVar124 = vsubps_avx(auVar97,auVar159._0_16_);
          auVar98._0_4_ = auVar222._0_4_ * auVar124._0_4_;
          auVar98._4_4_ = auVar222._4_4_ * auVar124._4_4_;
          auVar98._8_4_ = auVar222._8_4_ * auVar124._8_4_;
          auVar98._12_4_ = auVar222._12_4_ * auVar124._12_4_;
          pfVar2 = (float *)(uVar62 + 0x80 + (uVar71 ^ 0x10));
          auVar124 = vminps_avx(local_a50,auVar98);
          pfVar1 = (float *)(uVar62 + 0x20 + (uVar71 ^ 0x10));
          auVar106._0_4_ = fVar74 * *pfVar2 + *pfVar1;
          auVar106._4_4_ = fVar74 * pfVar2[1] + pfVar1[1];
          auVar106._8_4_ = fVar74 * pfVar2[2] + pfVar1[2];
          auVar106._12_4_ = fVar74 * pfVar2[3] + pfVar1[3];
          auVar94 = vsubps_avx(auVar106,auVar166._0_16_);
          pfVar2 = (float *)(uVar62 + 0x80 + (uVar73 ^ 0x10));
          pfVar1 = (float *)(uVar62 + 0x20 + (uVar73 ^ 0x10));
          auVar122._0_4_ = fVar74 * *pfVar2 + *pfVar1;
          auVar122._4_4_ = fVar74 * pfVar2[1] + pfVar1[1];
          auVar122._8_4_ = fVar74 * pfVar2[2] + pfVar1[2];
          auVar122._12_4_ = fVar74 * pfVar2[3] + pfVar1[3];
          auVar107._0_4_ = auVar232._0_4_ * auVar94._0_4_;
          auVar107._4_4_ = auVar232._4_4_ * auVar94._4_4_;
          auVar107._8_4_ = auVar232._8_4_ * auVar94._8_4_;
          auVar107._12_4_ = auVar232._12_4_ * auVar94._12_4_;
          auVar94 = vsubps_avx(auVar122,auVar175._0_16_);
          auVar123._0_4_ = auVar241._0_4_ * auVar94._0_4_;
          auVar123._4_4_ = auVar241._4_4_ * auVar94._4_4_;
          auVar123._8_4_ = auVar241._8_4_ * auVar94._8_4_;
          auVar123._12_4_ = auVar241._12_4_ * auVar94._12_4_;
          auVar94 = vminps_avx(auVar107,auVar123);
          auVar124 = vminps_avx(auVar124,auVar94);
          auVar89 = vcmpps_avx(auVar89,auVar124,2);
          if (((uint)uVar67 & 7) == 6) {
            auVar124 = vcmpps_avx(*(undefined1 (*) [16])(uVar62 + 0xe0),auVar156,2);
            auVar94 = vcmpps_avx(auVar156,*(undefined1 (*) [16])(uVar62 + 0xf0),1);
            auVar124 = vandps_avx(auVar124,auVar94);
            auVar89 = vandps_avx(auVar124,auVar89);
          }
          auVar89 = vpslld_avx(auVar89,0x1f);
          uVar63 = vmovmskps_avx(auVar89);
          if (uVar63 == 0) goto LAB_00b82262;
          uVar63 = uVar63 & 0xff;
          lVar65 = 0;
          if (uVar63 != 0) {
            for (; (uVar63 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
            }
          }
          uVar67 = *(ulong *)(uVar62 + lVar65 * 8);
          uVar63 = uVar63 - 1 & uVar63;
          uVar64 = (ulong)uVar63;
          if (uVar63 != 0) goto LAB_00b823b9;
        }
        if (((uint)uVar67 & 0xf) != 8) {
          local_ca8 = *(long *)(uVar67 & 0xfffffffffffffff0);
          fVar81 = (float)(*(int *)(local_ca8 + 8) - 1);
          fVar74 = fVar81 * (ray->dir).field_0.m128[3];
          auVar89 = vroundss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74),9);
          auVar89 = vminss_avx(auVar89,ZEXT416((uint)(fVar81 + -1.0)));
          auVar89 = vmaxss_avx(auVar149._0_16_,auVar89);
          auVar80 = ZEXT464((uint)(fVar74 - auVar89._0_4_));
          iVar61 = (int)auVar89._0_4_;
          uVar67 = *(ulong *)(local_ca8 + 0x30 +
                             (ulong)*(uint *)(local_ca8 + 0x2c) + (long)iVar61 * 8);
          if (uVar67 != 0) {
            *local_cb0 = uVar67;
            local_cb0 = local_cb0 + 1;
          }
          goto LAB_00b8221b;
        }
        uVar63 = *(uint *)(local_ca8 + 0xc);
        local_c10 = (ulong)uVar63;
        uVar6 = *(uint *)(local_ca8 + 0x10);
        local_c08 = (ulong)uVar6;
        lVar66 = (ulong)*(uint *)(local_ca8 + 0x28) * local_b88 +
                 (ulong)*(uint *)(local_ca8 + 0x24) + local_b90;
        uVar67 = uVar67 >> 4;
        lVar65 = lVar66 + uVar67 * 4;
        lVar70 = lVar66 + uVar67 * 4 + -4;
        auVar89 = *(undefined1 (*) [16])(lVar65 + -4 + local_c10 * 4);
        auVar124 = auVar89;
        if (2 < local_c08) {
          auVar124 = *(undefined1 (*) [16])(lVar70 + local_c10 * 8);
        }
        auVar156 = *(undefined1 (*) [16])(lVar66 + -4 + uVar67 * 4);
        if (local_c10 == 2) {
          auVar156 = vshufps_avx(auVar156,auVar156,0x54);
          auVar89 = vshufps_avx(auVar89,auVar89,0x54);
          auVar124 = vshufps_avx(auVar124,auVar124,0x54);
        }
        uVar67 = CONCAT44(0,*(uint *)(local_ca8 + 0x14));
        pauVar68 = (undefined1 (*) [16])(lVar65 + uVar67 * 4 + -4);
        auVar94 = *(undefined1 (*) [16])(*pauVar68 + local_c10 * 4);
        auVar200 = auVar94;
        if (2 < uVar6) {
          auVar200 = *(undefined1 (*) [16])(*pauVar68 + local_c10 * 8);
        }
        auVar120 = *pauVar68;
        if (uVar63 == 2) {
          auVar120 = vshufps_avx(auVar120,auVar120,0x54);
          auVar94 = vshufps_avx(auVar94,auVar94,0x54);
          auVar200 = vshufps_avx(auVar200,auVar200,0x54);
        }
        pauVar72 = (undefined1 (*) [16])(lVar65 + uVar67 * 8 + -4);
        auVar121 = *(undefined1 (*) [16])(*pauVar72 + local_c10 * 4);
        auVar87 = auVar121;
        if (2 < uVar6) {
          auVar87 = *(undefined1 (*) [16])(*pauVar72 + local_c10 * 8);
        }
        _local_c80 = *pauVar72;
        local_bc0._0_8_ = uVar67;
        if (uVar63 == 2) {
          _local_c80 = vshufps_avx(_local_c80,_local_c80,0x54);
          auVar121 = vshufps_avx(auVar121,auVar121,0x54);
          auVar87 = vshufps_avx(auVar87,auVar87,0x54);
        }
        uVar62 = (ulong)(*(uint *)(local_ca8 + 0x28) & 0xfffffffc);
        auVar88 = *(undefined1 (*) [16])(lVar70 + uVar62 + local_c10 * 4);
        auVar95 = auVar88;
        if (2 < uVar6) {
          auVar95 = *(undefined1 (*) [16])(lVar70 + uVar62 + local_c10 * 8);
        }
        auVar96 = *(undefined1 (*) [16])(lVar70 + uVar62);
        if (uVar63 == 2) {
          auVar96 = vshufps_avx(auVar96,auVar96,0x54);
          auVar88 = vshufps_avx(auVar88,auVar88,0x54);
          auVar95 = vshufps_avx(auVar95,auVar95,0x54);
        }
        pauVar68 = (undefined1 (*) [16])(*pauVar68 + uVar62);
        auVar97 = *(undefined1 (*) [16])(*pauVar68 + local_c10 * 4);
        auVar98 = auVar97;
        if (2 < uVar6) {
          auVar98 = *(undefined1 (*) [16])(*pauVar68 + local_c10 * 8);
        }
        auVar104 = *pauVar68;
        if (uVar63 == 2) {
          auVar104 = vshufps_avx(auVar104,auVar104,0x54);
          auVar97 = vshufps_avx(auVar97,auVar97,0x54);
          auVar98 = vshufps_avx(auVar98,auVar98,0x54);
        }
        pauVar68 = (undefined1 (*) [16])(*pauVar72 + uVar62);
        auVar105 = *pauVar68;
        auVar106 = *(undefined1 (*) [16])(*pauVar68 + local_c10 * 4);
        auVar107 = auVar106;
        if (2 < uVar6) {
          auVar107 = *(undefined1 (*) [16])(*pauVar68 + local_c10 * 8);
        }
        auVar99._16_16_ = auVar89;
        auVar99._0_16_ = auVar156;
        auVar76._16_16_ = auVar124;
        auVar76._0_16_ = auVar89;
        auVar22 = vunpcklps_avx(auVar99,auVar76);
        auVar99 = vshufps_avx(auVar99,auVar99,0xa5);
        auVar76 = vshufps_avx(auVar76,auVar76,0x94);
        auVar90._16_16_ = auVar94;
        auVar90._0_16_ = auVar120;
        auVar100._16_16_ = auVar200;
        auVar100._0_16_ = auVar94;
        auVar23 = vunpcklps_avx(auVar90,auVar100);
        auVar90 = vshufps_avx(auVar90,auVar90,0xa5);
        auVar100 = vshufps_avx(auVar100,auVar100,0x94);
        auVar101._16_16_ = auVar121;
        auVar101._0_16_ = _local_c80;
        auVar108._16_16_ = auVar87;
        auVar108._0_16_ = auVar121;
        auVar24 = vunpcklps_avx(auVar101,auVar108);
        auVar101 = vshufps_avx(auVar101,auVar101,0xa5);
        auVar108 = vshufps_avx(auVar108,auVar108,0x94);
        auVar157._16_16_ = auVar88;
        auVar157._0_16_ = auVar96;
        auVar186._16_16_ = auVar95;
        auVar186._0_16_ = auVar88;
        auVar25 = vunpcklps_avx(auVar157,auVar186);
        auVar157 = vshufps_avx(auVar157,auVar157,0xa5);
        auVar186 = vshufps_avx(auVar186,auVar186,0x94);
        auVar162._16_16_ = auVar97;
        auVar162._0_16_ = auVar104;
        auVar219._16_16_ = auVar98;
        auVar219._0_16_ = auVar97;
        auVar26 = vunpcklps_avx(auVar162,auVar219);
        auVar162 = vshufps_avx(auVar162,auVar162,0xa5);
        auVar219 = vshufps_avx(auVar219,auVar219,0x94);
        if (uVar63 == 2) {
          auVar105 = vshufps_avx(auVar105,auVar105,0x54);
          auVar106 = vshufps_avx(auVar106,auVar106,0x54);
          auVar107 = vshufps_avx(auVar107,auVar107,0x54);
        }
        auVar220._16_16_ = auVar106;
        auVar220._0_16_ = auVar105;
        auVar230._16_16_ = auVar107;
        auVar230._0_16_ = auVar106;
        fStack_c84 = auVar25._28_4_ + 0.0;
        local_ca0._4_4_ =
             auVar22._4_4_ * (float)local_a00._4_4_ + (float)local_9e0._4_4_ * auVar25._4_4_;
        local_ca0._0_4_ =
             auVar22._0_4_ * (float)local_a00._0_4_ + (float)local_9e0._0_4_ * auVar25._0_4_;
        fStack_c98 = auVar22._8_4_ * fStack_9f8 + fStack_9d8 * auVar25._8_4_;
        fStack_c94 = auVar22._12_4_ * fStack_9f4 + fStack_9d4 * auVar25._12_4_;
        fStack_c90 = auVar22._16_4_ * fStack_9f0 + fStack_9d0 * auVar25._16_4_;
        fStack_c8c = auVar22._20_4_ * fStack_9ec + fStack_9cc * auVar25._20_4_;
        fStack_c88 = auVar22._24_4_ * fStack_9e8 + fStack_9c8 * auVar25._24_4_;
        auVar132._0_4_ =
             (float)local_a00._0_4_ * auVar23._0_4_ + (float)local_9e0._0_4_ * auVar26._0_4_;
        auVar132._4_4_ =
             (float)local_a00._4_4_ * auVar23._4_4_ + (float)local_9e0._4_4_ * auVar26._4_4_;
        auVar132._8_4_ = fStack_9f8 * auVar23._8_4_ + fStack_9d8 * auVar26._8_4_;
        auVar132._12_4_ = fStack_9f4 * auVar23._12_4_ + fStack_9d4 * auVar26._12_4_;
        auVar132._16_4_ = fStack_9f0 * auVar23._16_4_ + fStack_9d0 * auVar26._16_4_;
        auVar132._20_4_ = fStack_9ec * auVar23._20_4_ + fStack_9cc * auVar26._20_4_;
        auVar132._24_4_ = fStack_9e8 * auVar23._24_4_ + fStack_9c8 * auVar26._24_4_;
        auVar132._28_4_ = auVar23._28_4_ + fStack_c84;
        auVar25 = vunpcklps_avx(auVar220,auVar230);
        auVar22 = vshufps_avx(auVar220,auVar220,0xa5);
        auVar23 = vshufps_avx(auVar230,auVar230,0x94);
        auVar91._0_4_ =
             (float)local_a00._0_4_ * auVar24._0_4_ + (float)local_9e0._0_4_ * auVar25._0_4_;
        auVar91._4_4_ =
             (float)local_a00._4_4_ * auVar24._4_4_ + (float)local_9e0._4_4_ * auVar25._4_4_;
        auVar91._8_4_ = fStack_9f8 * auVar24._8_4_ + fStack_9d8 * auVar25._8_4_;
        auVar91._12_4_ = fStack_9f4 * auVar24._12_4_ + fStack_9d4 * auVar25._12_4_;
        auVar91._16_4_ = fStack_9f0 * auVar24._16_4_ + fStack_9d0 * auVar25._16_4_;
        auVar91._20_4_ = fStack_9ec * auVar24._20_4_ + fStack_9cc * auVar25._20_4_;
        auVar91._24_4_ = fStack_9e8 * auVar24._24_4_ + fStack_9c8 * auVar25._24_4_;
        auVar91._28_4_ = auVar24._28_4_ + auVar25._28_4_;
        local_c00._0_4_ = auVar99._0_4_;
        local_c00._4_4_ = auVar99._4_4_;
        fStack_bf8 = auVar99._8_4_;
        fStack_bf4 = auVar99._12_4_;
        fStack_bf0 = auVar99._16_4_;
        fStack_bec = auVar99._20_4_;
        fStack_be8 = auVar99._24_4_;
        auVar77._0_4_ =
             (float)local_a00._0_4_ * (float)local_c00 + (float)local_9e0._0_4_ * auVar157._0_4_;
        auVar77._4_4_ =
             (float)local_a00._4_4_ * local_c00._4_4_ + (float)local_9e0._4_4_ * auVar157._4_4_;
        auVar77._8_4_ = fStack_9f8 * fStack_bf8 + fStack_9d8 * auVar157._8_4_;
        auVar77._12_4_ = fStack_9f4 * fStack_bf4 + fStack_9d4 * auVar157._12_4_;
        auVar77._16_4_ = fStack_9f0 * fStack_bf0 + fStack_9d0 * auVar157._16_4_;
        auVar77._20_4_ = fStack_9ec * fStack_bec + fStack_9cc * auVar157._20_4_;
        auVar77._24_4_ = fStack_9e8 * fStack_be8 + fStack_9c8 * auVar157._24_4_;
        auVar77._28_4_ = auVar22._28_4_ + auVar25._28_4_;
        fVar74 = auVar90._28_4_;
        auVar174._0_4_ =
             (float)local_9e0._0_4_ * auVar162._0_4_ + (float)local_a00._0_4_ * auVar90._0_4_;
        auVar174._4_4_ =
             (float)local_9e0._4_4_ * auVar162._4_4_ + (float)local_a00._4_4_ * auVar90._4_4_;
        auVar174._8_4_ = fStack_9d8 * auVar162._8_4_ + fStack_9f8 * auVar90._8_4_;
        auVar174._12_4_ = fStack_9d4 * auVar162._12_4_ + fStack_9f4 * auVar90._12_4_;
        auVar174._16_4_ = fStack_9d0 * auVar162._16_4_ + fStack_9f0 * auVar90._16_4_;
        auVar174._20_4_ = fStack_9cc * auVar162._20_4_ + fStack_9ec * auVar90._20_4_;
        auVar174._24_4_ = fStack_9c8 * auVar162._24_4_ + fStack_9e8 * auVar90._24_4_;
        auVar174._28_4_ = auVar157._28_4_ + fVar74;
        auVar187._0_4_ =
             (float)local_9e0._0_4_ * auVar22._0_4_ + (float)local_a00._0_4_ * auVar101._0_4_;
        auVar187._4_4_ =
             (float)local_9e0._4_4_ * auVar22._4_4_ + (float)local_a00._4_4_ * auVar101._4_4_;
        auVar187._8_4_ = fStack_9d8 * auVar22._8_4_ + fStack_9f8 * auVar101._8_4_;
        auVar187._12_4_ = fStack_9d4 * auVar22._12_4_ + fStack_9f4 * auVar101._12_4_;
        auVar187._16_4_ = fStack_9d0 * auVar22._16_4_ + fStack_9f0 * auVar101._16_4_;
        auVar187._20_4_ = fStack_9cc * auVar22._20_4_ + fStack_9ec * auVar101._20_4_;
        auVar187._24_4_ = fStack_9c8 * auVar22._24_4_ + fStack_9e8 * auVar101._24_4_;
        auVar187._28_4_ = auVar162._28_4_ + fVar74;
        local_ce0._0_4_ = auVar76._0_4_;
        local_ce0._4_4_ = auVar76._4_4_;
        uStack_cd8._0_4_ = auVar76._8_4_;
        uStack_cd8._4_4_ = auVar76._12_4_;
        uStack_cd0._0_4_ = auVar76._16_4_;
        uStack_cd0._4_4_ = auVar76._20_4_;
        uStack_cc8._0_4_ = auVar76._24_4_;
        auVar163._0_4_ =
             (float)local_a00._0_4_ * (float)local_ce0._0_4_ +
             (float)local_9e0._0_4_ * auVar186._0_4_;
        auVar163._4_4_ =
             (float)local_a00._4_4_ * (float)local_ce0._4_4_ +
             (float)local_9e0._4_4_ * auVar186._4_4_;
        auVar163._8_4_ = fStack_9f8 * (float)uStack_cd8 + fStack_9d8 * auVar186._8_4_;
        auVar163._12_4_ = fStack_9f4 * uStack_cd8._4_4_ + fStack_9d4 * auVar186._12_4_;
        auVar163._16_4_ = fStack_9f0 * (float)uStack_cd0 + fStack_9d0 * auVar186._16_4_;
        auVar163._20_4_ = fStack_9ec * uStack_cd0._4_4_ + fStack_9cc * auVar186._20_4_;
        auVar163._24_4_ = fStack_9e8 * (float)uStack_cc8 + fStack_9c8 * auVar186._24_4_;
        auVar163._28_4_ = auVar219._28_4_ + fVar74;
        local_be0._0_4_ = auVar100._0_4_;
        local_be0._4_4_ = auVar100._4_4_;
        auStack_bd8._0_4_ = auVar100._8_4_;
        auStack_bd8._4_4_ = auVar100._12_4_;
        fStack_bd0 = auVar100._16_4_;
        fStack_bcc = auVar100._20_4_;
        fStack_bc8 = auVar100._24_4_;
        auVar201._0_4_ =
             (float)local_a00._0_4_ * (float)local_be0._0_4_ +
             (float)local_9e0._0_4_ * auVar219._0_4_;
        auVar201._4_4_ =
             (float)local_a00._4_4_ * (float)local_be0._4_4_ +
             (float)local_9e0._4_4_ * auVar219._4_4_;
        auVar201._8_4_ = fStack_9f8 * (float)auStack_bd8._0_4_ + fStack_9d8 * auVar219._8_4_;
        auVar201._12_4_ = fStack_9f4 * (float)auStack_bd8._4_4_ + fStack_9d4 * auVar219._12_4_;
        auVar201._16_4_ = fStack_9f0 * fStack_bd0 + fStack_9d0 * auVar219._16_4_;
        auVar201._20_4_ = fStack_9ec * fStack_bcc + fStack_9cc * auVar219._20_4_;
        auVar201._24_4_ = fStack_9e8 * fStack_bc8 + fStack_9c8 * auVar219._24_4_;
        auVar201._28_4_ = fVar74 + auVar101._28_4_;
        local_c80._0_4_ = auVar108._0_4_;
        local_c80._4_4_ = auVar108._4_4_;
        uStack_c78._0_4_ = auVar108._8_4_;
        uStack_c78._4_4_ = auVar108._12_4_;
        uStack_c70._0_4_ = auVar108._16_4_;
        uStack_c70._4_4_ = auVar108._20_4_;
        uStack_c68._0_4_ = auVar108._24_4_;
        uVar60 = *(undefined4 *)&(ray->org).field_0;
        auVar210._4_4_ = uVar60;
        auVar210._0_4_ = uVar60;
        auVar210._8_4_ = uVar60;
        auVar210._12_4_ = uVar60;
        auVar210._16_4_ = uVar60;
        auVar210._20_4_ = uVar60;
        auVar210._24_4_ = uVar60;
        auVar210._28_4_ = uVar60;
        uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
        auVar221._4_4_ = uVar3;
        auVar221._0_4_ = uVar3;
        auVar221._8_4_ = uVar3;
        auVar221._12_4_ = uVar3;
        auVar221._16_4_ = uVar3;
        auVar221._20_4_ = uVar3;
        auVar221._24_4_ = uVar3;
        auVar221._28_4_ = uVar3;
        auVar231._0_4_ =
             (float)local_a00._0_4_ * (float)local_c80._0_4_ +
             (float)local_9e0._0_4_ * auVar23._0_4_;
        auVar231._4_4_ =
             (float)local_a00._4_4_ * (float)local_c80._4_4_ +
             (float)local_9e0._4_4_ * auVar23._4_4_;
        auVar231._8_4_ = fStack_9f8 * (float)uStack_c78 + fStack_9d8 * auVar23._8_4_;
        auVar231._12_4_ = fStack_9f4 * uStack_c78._4_4_ + fStack_9d4 * auVar23._12_4_;
        auVar231._16_4_ = fStack_9f0 * (float)uStack_c70 + fStack_9d0 * auVar23._16_4_;
        auVar231._20_4_ = fStack_9ec * uStack_c70._4_4_ + fStack_9cc * auVar23._20_4_;
        auVar231._24_4_ = fStack_9e8 * (float)uStack_c68 + fStack_9c8 * auVar23._24_4_;
        auVar231._28_4_ = fStack_9e4 + auVar186._28_4_;
        uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
        auVar240._4_4_ = uVar3;
        auVar240._0_4_ = uVar3;
        auVar240._8_4_ = uVar3;
        auVar240._12_4_ = uVar3;
        auVar240._16_4_ = uVar3;
        auVar240._20_4_ = uVar3;
        auVar240._24_4_ = uVar3;
        auVar240._28_4_ = uVar3;
        local_a80._0_32_ = vsubps_avx(_local_ca0,auVar210);
        local_aa0 = vsubps_avx(auVar132,auVar221);
        local_ac0 = vsubps_avx(auVar91,auVar240);
        auVar99 = vsubps_avx(auVar77,auVar210);
        auVar76 = vsubps_avx(auVar174,auVar221);
        auVar90 = vsubps_avx(auVar187,auVar240);
        auVar100 = vsubps_avx(auVar163,auVar210);
        auVar101 = vsubps_avx(auVar201,auVar221);
        auVar108 = vsubps_avx(auVar231,auVar240);
        local_980 = vsubps_avx(auVar100,local_a80._0_32_);
        local_9a0 = vsubps_avx(auVar101,local_aa0);
        local_9c0 = vsubps_avx(auVar108,local_ac0);
        fVar8 = local_aa0._0_4_;
        fVar74 = auVar101._0_4_ + fVar8;
        fVar11 = local_aa0._4_4_;
        fVar81 = auVar101._4_4_ + fVar11;
        fVar111 = local_aa0._8_4_;
        fVar82 = auVar101._8_4_ + fVar111;
        fVar114 = local_aa0._12_4_;
        fVar83 = auVar101._12_4_ + fVar114;
        fVar13 = local_aa0._16_4_;
        fVar84 = auVar101._16_4_ + fVar13;
        fVar16 = local_aa0._20_4_;
        fVar85 = auVar101._20_4_ + fVar16;
        fVar19 = local_aa0._24_4_;
        fVar86 = auVar101._24_4_ + fVar19;
        fVar75 = local_aa0._28_4_;
        fVar9 = local_ac0._0_4_;
        fVar173 = auVar108._0_4_ + fVar9;
        fVar12 = local_ac0._4_4_;
        fVar176 = auVar108._4_4_ + fVar12;
        fVar112 = local_ac0._8_4_;
        fVar177 = auVar108._8_4_ + fVar112;
        fVar116 = local_ac0._12_4_;
        fVar178 = auVar108._12_4_ + fVar116;
        fVar14 = local_ac0._16_4_;
        fVar179 = auVar108._16_4_ + fVar14;
        fVar17 = local_ac0._20_4_;
        fVar180 = auVar108._20_4_ + fVar17;
        fVar20 = local_ac0._24_4_;
        fVar181 = auVar108._24_4_ + fVar20;
        fVar117 = auVar108._28_4_;
        fVar119 = local_9c0._0_4_;
        fVar125 = local_9c0._4_4_;
        auVar23._4_4_ = fVar125 * fVar81;
        auVar23._0_4_ = fVar119 * fVar74;
        fVar126 = local_9c0._8_4_;
        auVar23._8_4_ = fVar126 * fVar82;
        fVar127 = local_9c0._12_4_;
        auVar23._12_4_ = fVar127 * fVar83;
        fVar128 = local_9c0._16_4_;
        auVar23._16_4_ = fVar128 * fVar84;
        fVar129 = local_9c0._20_4_;
        auVar23._20_4_ = fVar129 * fVar85;
        fVar130 = local_9c0._24_4_;
        auVar23._24_4_ = fVar130 * fVar86;
        auVar23._28_4_ = auVar201._28_4_;
        fVar182 = local_9a0._0_4_;
        fVar191 = local_9a0._4_4_;
        auVar24._4_4_ = fVar191 * fVar176;
        auVar24._0_4_ = fVar182 * fVar173;
        fVar193 = local_9a0._8_4_;
        auVar24._8_4_ = fVar193 * fVar177;
        fVar194 = local_9a0._12_4_;
        auVar24._12_4_ = fVar194 * fVar178;
        fVar195 = local_9a0._16_4_;
        auVar24._16_4_ = fVar195 * fVar179;
        fVar196 = local_9a0._20_4_;
        auVar24._20_4_ = fVar196 * fVar180;
        fVar197 = local_9a0._24_4_;
        auVar24._24_4_ = fVar197 * fVar181;
        auVar24._28_4_ = uVar60;
        auVar157 = vsubps_avx(auVar24,auVar23);
        fVar10 = local_a80._0_4_;
        fVar199 = auVar100._0_4_ + fVar10;
        fVar110 = local_a80._4_4_;
        fVar203 = auVar100._4_4_ + fVar110;
        fVar113 = local_a80._8_4_;
        fVar204 = auVar100._8_4_ + fVar113;
        fVar118 = local_a80._12_4_;
        fVar205 = auVar100._12_4_ + fVar118;
        fVar15 = local_a80._16_4_;
        fVar206 = auVar100._16_4_ + fVar15;
        fVar18 = local_a80._20_4_;
        fVar207 = auVar100._20_4_ + fVar18;
        fVar21 = local_a80._24_4_;
        fVar208 = auVar100._24_4_ + fVar21;
        fVar160 = auVar100._28_4_;
        fVar161 = local_980._0_4_;
        fVar167 = local_980._4_4_;
        auVar25._4_4_ = fVar167 * fVar176;
        auVar25._0_4_ = fVar161 * fVar173;
        fVar168 = local_980._8_4_;
        auVar25._8_4_ = fVar168 * fVar177;
        fVar169 = local_980._12_4_;
        auVar25._12_4_ = fVar169 * fVar178;
        fVar170 = local_980._16_4_;
        auVar25._16_4_ = fVar170 * fVar179;
        fVar171 = local_980._20_4_;
        auVar25._20_4_ = fVar171 * fVar180;
        fVar172 = local_980._24_4_;
        auVar25._24_4_ = fVar172 * fVar181;
        auVar25._28_4_ = fVar117 + local_ac0._28_4_;
        auVar23 = local_9c0;
        auVar26._4_4_ = fVar203 * fVar125;
        auVar26._0_4_ = fVar199 * fVar119;
        auVar26._8_4_ = fVar204 * fVar126;
        auVar26._12_4_ = fVar205 * fVar127;
        auVar26._16_4_ = fVar206 * fVar128;
        auVar26._20_4_ = fVar207 * fVar129;
        auVar26._24_4_ = fVar208 * fVar130;
        auVar26._28_4_ = uVar60;
        auVar186 = vsubps_avx(auVar26,auVar25);
        auVar27._4_4_ = fVar191 * fVar203;
        auVar27._0_4_ = fVar182 * fVar199;
        auVar27._8_4_ = fVar193 * fVar204;
        auVar27._12_4_ = fVar194 * fVar205;
        auVar27._16_4_ = fVar195 * fVar206;
        auVar27._20_4_ = fVar196 * fVar207;
        auVar27._24_4_ = fVar197 * fVar208;
        auVar27._28_4_ = fVar160 + local_a80._28_4_;
        auVar28._4_4_ = fVar167 * fVar81;
        auVar28._0_4_ = fVar161 * fVar74;
        auVar28._8_4_ = fVar168 * fVar82;
        auVar28._12_4_ = fVar169 * fVar83;
        auVar28._16_4_ = fVar170 * fVar84;
        auVar28._20_4_ = fVar171 * fVar85;
        auVar28._24_4_ = fVar172 * fVar86;
        auVar28._28_4_ = auVar101._28_4_ + fVar75;
        fVar74 = (ray->dir).field_0.m128[2];
        local_be0._4_4_ = fVar74;
        local_be0._0_4_ = fVar74;
        auStack_bd8._0_4_ = fVar74;
        auStack_bd8._4_4_ = fVar74;
        fStack_bd0 = fVar74;
        fStack_bcc = fVar74;
        fStack_bc8 = fVar74;
        register0x0000131c = fVar74;
        auVar162 = vsubps_avx(auVar28,auVar27);
        local_c00._4_4_ = (ray->dir).field_0.m128[1];
        fVar81 = (ray->dir).field_0.m128[0];
        local_ce0._0_4_ =
             auVar157._0_4_ * fVar81 + local_c00._4_4_ * auVar186._0_4_ + fVar74 * auVar162._0_4_;
        local_ce0._4_4_ =
             auVar157._4_4_ * fVar81 + local_c00._4_4_ * auVar186._4_4_ + fVar74 * auVar162._4_4_;
        fVar85 = auVar157._8_4_ * fVar81 +
                 local_c00._4_4_ * auVar186._8_4_ + fVar74 * auVar162._8_4_;
        fVar173 = auVar157._12_4_ * fVar81 +
                  local_c00._4_4_ * auVar186._12_4_ + fVar74 * auVar162._12_4_;
        fVar177 = auVar157._16_4_ * fVar81 +
                  local_c00._4_4_ * auVar186._16_4_ + fVar74 * auVar162._16_4_;
        fVar179 = auVar157._20_4_ * fVar81 +
                  local_c00._4_4_ * auVar186._20_4_ + fVar74 * auVar162._20_4_;
        fVar181 = auVar157._24_4_ * fVar81 +
                  local_c00._4_4_ * auVar186._24_4_ + fVar74 * auVar162._24_4_;
        uStack_cc8._4_4_ = auVar157._28_4_ + auVar186._28_4_ + auVar162._28_4_;
        uStack_cd8._0_4_ = fVar85;
        uStack_cd8._4_4_ = fVar173;
        uStack_cd0._0_4_ = fVar177;
        uStack_cd0._4_4_ = fVar179;
        auVar59 = _local_ce0;
        uStack_cc8._0_4_ = fVar181;
        auVar219 = _local_ce0;
        auVar157 = vsubps_avx(local_aa0,auVar76);
        auVar186 = vsubps_avx(local_ac0,auVar90);
        fVar83 = fVar8 + auVar76._0_4_;
        fVar84 = fVar11 + auVar76._4_4_;
        fVar86 = fVar111 + auVar76._8_4_;
        fVar176 = fVar114 + auVar76._12_4_;
        fVar178 = fVar13 + auVar76._16_4_;
        fVar180 = fVar16 + auVar76._20_4_;
        fVar199 = fVar19 + auVar76._24_4_;
        fVar82 = auVar90._0_4_ + fVar9;
        fVar203 = auVar90._4_4_ + fVar12;
        fVar204 = auVar90._8_4_ + fVar112;
        fVar205 = auVar90._12_4_ + fVar116;
        fVar206 = auVar90._16_4_ + fVar14;
        fVar207 = auVar90._20_4_ + fVar17;
        fVar208 = auVar90._24_4_ + fVar20;
        fVar239 = auVar186._0_4_;
        fVar242 = auVar186._4_4_;
        auVar29._4_4_ = fVar242 * fVar84;
        auVar29._0_4_ = fVar239 * fVar83;
        fVar243 = auVar186._8_4_;
        auVar29._8_4_ = fVar243 * fVar86;
        fVar244 = auVar186._12_4_;
        auVar29._12_4_ = fVar244 * fVar176;
        fVar245 = auVar186._16_4_;
        auVar29._16_4_ = fVar245 * fVar178;
        fVar246 = auVar186._20_4_;
        auVar29._20_4_ = fVar246 * fVar180;
        fVar247 = auVar186._24_4_;
        auVar29._24_4_ = fVar247 * fVar199;
        auVar29._28_4_ = auVar231._28_4_;
        fVar218 = auVar157._0_4_;
        fVar223 = auVar157._4_4_;
        auVar30._4_4_ = fVar223 * fVar203;
        auVar30._0_4_ = fVar218 * fVar82;
        fVar224 = auVar157._8_4_;
        auVar30._8_4_ = fVar224 * fVar204;
        fVar225 = auVar157._12_4_;
        auVar30._12_4_ = fVar225 * fVar205;
        fVar226 = auVar157._16_4_;
        auVar30._16_4_ = fVar226 * fVar206;
        fVar227 = auVar157._20_4_;
        auVar30._20_4_ = fVar227 * fVar207;
        fVar228 = auVar157._24_4_;
        auVar30._24_4_ = fVar228 * fVar208;
        auVar30._28_4_ = fVar75;
        auVar157 = vsubps_avx(auVar30,auVar29);
        auVar186 = vsubps_avx(local_a80._0_32_,auVar99);
        fVar229 = auVar186._0_4_;
        fVar233 = auVar186._4_4_;
        auVar31._4_4_ = fVar233 * fVar203;
        auVar31._0_4_ = fVar229 * fVar82;
        fVar234 = auVar186._8_4_;
        auVar31._8_4_ = fVar234 * fVar204;
        fVar235 = auVar186._12_4_;
        auVar31._12_4_ = fVar235 * fVar205;
        fVar236 = auVar186._16_4_;
        auVar31._16_4_ = fVar236 * fVar206;
        fVar237 = auVar186._20_4_;
        auVar31._20_4_ = fVar237 * fVar207;
        fVar238 = auVar186._24_4_;
        auVar31._24_4_ = fVar238 * fVar208;
        auVar31._28_4_ = auVar90._28_4_ + local_ac0._28_4_;
        fVar203 = auVar99._0_4_ + fVar10;
        fVar204 = auVar99._4_4_ + fVar110;
        fVar205 = auVar99._8_4_ + fVar113;
        fVar206 = auVar99._12_4_ + fVar118;
        fVar207 = auVar99._16_4_ + fVar15;
        fVar208 = auVar99._20_4_ + fVar18;
        fVar198 = auVar99._24_4_ + fVar21;
        auVar32._4_4_ = fVar242 * fVar204;
        auVar32._0_4_ = fVar239 * fVar203;
        auVar32._8_4_ = fVar243 * fVar205;
        auVar32._12_4_ = fVar244 * fVar206;
        auVar32._16_4_ = fVar245 * fVar207;
        auVar32._20_4_ = fVar246 * fVar208;
        fVar82 = auVar99._28_4_;
        auVar32._24_4_ = fVar247 * fVar198;
        auVar32._28_4_ = fVar82;
        auVar186 = vsubps_avx(auVar32,auVar31);
        auVar33._4_4_ = fVar223 * fVar204;
        auVar33._0_4_ = fVar218 * fVar203;
        auVar33._8_4_ = fVar224 * fVar205;
        auVar33._12_4_ = fVar225 * fVar206;
        auVar33._16_4_ = fVar226 * fVar207;
        auVar33._20_4_ = fVar227 * fVar208;
        auVar33._24_4_ = fVar228 * fVar198;
        auVar33._28_4_ = fVar82;
        auVar34._4_4_ = fVar233 * fVar84;
        auVar34._0_4_ = fVar229 * fVar83;
        auVar34._8_4_ = fVar234 * fVar86;
        auVar34._12_4_ = fVar235 * fVar176;
        auVar34._16_4_ = fVar236 * fVar178;
        auVar34._20_4_ = fVar237 * fVar180;
        auVar34._24_4_ = fVar238 * fVar199;
        auVar34._28_4_ = fVar75 + auVar76._28_4_;
        auVar162 = vsubps_avx(auVar34,auVar33);
        fVar183 = fVar81 * auVar157._0_4_ +
                  local_c00._4_4_ * auVar186._0_4_ + fVar74 * auVar162._0_4_;
        fVar192 = fVar81 * auVar157._4_4_ +
                  local_c00._4_4_ * auVar186._4_4_ + fVar74 * auVar162._4_4_;
        auVar184._0_8_ = CONCAT44(fVar192,fVar183);
        auVar184._8_4_ =
             fVar81 * auVar157._8_4_ + local_c00._4_4_ * auVar186._8_4_ + fVar74 * auVar162._8_4_;
        auVar184._12_4_ =
             fVar81 * auVar157._12_4_ + local_c00._4_4_ * auVar186._12_4_ + fVar74 * auVar162._12_4_
        ;
        auVar185._16_4_ =
             fVar81 * auVar157._16_4_ + local_c00._4_4_ * auVar186._16_4_ + fVar74 * auVar162._16_4_
        ;
        auVar185._0_16_ = auVar184;
        auVar185._20_4_ =
             fVar81 * auVar157._20_4_ + local_c00._4_4_ * auVar186._20_4_ + fVar74 * auVar162._20_4_
        ;
        auVar188._24_4_ =
             fVar81 * auVar157._24_4_ + local_c00._4_4_ * auVar186._24_4_ + fVar74 * auVar162._24_4_
        ;
        auVar188._0_24_ = auVar185;
        auVar188._28_4_ = auVar157._28_4_ + auVar186._28_4_ + auVar162._28_4_;
        auVar157 = vsubps_avx(auVar99,auVar100);
        fVar131 = auVar99._0_4_ + auVar100._0_4_;
        fVar140 = auVar99._4_4_ + auVar100._4_4_;
        fVar141 = auVar99._8_4_ + auVar100._8_4_;
        fVar142 = auVar99._12_4_ + auVar100._12_4_;
        fVar143 = auVar99._16_4_ + auVar100._16_4_;
        fVar144 = auVar99._20_4_ + auVar100._20_4_;
        fVar145 = auVar99._24_4_ + auVar100._24_4_;
        auVar99 = vsubps_avx(auVar76,auVar101);
        fVar204 = auVar76._0_4_ + auVar101._0_4_;
        fVar205 = auVar76._4_4_ + auVar101._4_4_;
        fVar206 = auVar76._8_4_ + auVar101._8_4_;
        fVar207 = auVar76._12_4_ + auVar101._12_4_;
        fVar208 = auVar76._16_4_ + auVar101._16_4_;
        fVar198 = auVar76._20_4_ + auVar101._20_4_;
        fVar115 = auVar76._24_4_ + auVar101._24_4_;
        auVar100 = vsubps_avx(auVar90,auVar108);
        fVar84 = auVar90._0_4_ + auVar108._0_4_;
        fVar86 = auVar90._4_4_ + auVar108._4_4_;
        fVar176 = auVar90._8_4_ + auVar108._8_4_;
        fVar178 = auVar90._12_4_ + auVar108._12_4_;
        fVar180 = auVar90._16_4_ + auVar108._16_4_;
        fVar199 = auVar90._20_4_ + auVar108._20_4_;
        fVar203 = auVar90._24_4_ + auVar108._24_4_;
        fVar146 = auVar100._0_4_;
        fVar150 = auVar100._4_4_;
        auVar35._4_4_ = fVar150 * fVar205;
        auVar35._0_4_ = fVar146 * fVar204;
        fVar151 = auVar100._8_4_;
        auVar35._8_4_ = fVar151 * fVar206;
        fVar152 = auVar100._12_4_;
        auVar35._12_4_ = fVar152 * fVar207;
        fVar153 = auVar100._16_4_;
        auVar35._16_4_ = fVar153 * fVar208;
        fVar154 = auVar100._20_4_;
        auVar35._20_4_ = fVar154 * fVar198;
        fVar155 = auVar100._24_4_;
        auVar35._24_4_ = fVar155 * fVar115;
        auVar35._28_4_ = fVar117;
        fVar209 = auVar99._0_4_;
        fVar212 = auVar99._4_4_;
        auVar36._4_4_ = fVar212 * fVar86;
        auVar36._0_4_ = fVar209 * fVar84;
        fVar213 = auVar99._8_4_;
        auVar36._8_4_ = fVar213 * fVar176;
        fVar214 = auVar99._12_4_;
        auVar36._12_4_ = fVar214 * fVar178;
        fVar215 = auVar99._16_4_;
        auVar36._16_4_ = fVar215 * fVar180;
        fVar216 = auVar99._20_4_;
        auVar36._20_4_ = fVar216 * fVar199;
        fVar217 = auVar99._24_4_;
        auVar36._24_4_ = fVar217 * fVar203;
        auVar36._28_4_ = fVar160;
        auVar99 = vsubps_avx(auVar36,auVar35);
        fVar75 = auVar157._0_4_;
        fVar83 = auVar157._4_4_;
        auVar37._4_4_ = fVar83 * fVar86;
        auVar37._0_4_ = fVar75 * fVar84;
        fVar84 = auVar157._8_4_;
        auVar37._8_4_ = fVar84 * fVar176;
        fVar86 = auVar157._12_4_;
        auVar37._12_4_ = fVar86 * fVar178;
        fVar176 = auVar157._16_4_;
        auVar37._16_4_ = fVar176 * fVar180;
        fVar178 = auVar157._20_4_;
        auVar37._20_4_ = fVar178 * fVar199;
        fVar180 = auVar157._24_4_;
        auVar37._24_4_ = fVar180 * fVar203;
        auVar37._28_4_ = auVar90._28_4_ + fVar117;
        auVar38._4_4_ = fVar150 * fVar140;
        auVar38._0_4_ = fVar146 * fVar131;
        auVar38._8_4_ = fVar151 * fVar141;
        auVar38._12_4_ = fVar152 * fVar142;
        auVar38._16_4_ = fVar153 * fVar143;
        auVar38._20_4_ = fVar154 * fVar144;
        auVar38._24_4_ = fVar155 * fVar145;
        auVar38._28_4_ = fVar160;
        auVar90 = vsubps_avx(auVar38,auVar37);
        auVar39._4_4_ = fVar212 * fVar140;
        auVar39._0_4_ = fVar209 * fVar131;
        auVar39._8_4_ = fVar213 * fVar141;
        auVar39._12_4_ = fVar214 * fVar142;
        auVar39._16_4_ = fVar215 * fVar143;
        auVar39._20_4_ = fVar216 * fVar144;
        auVar39._24_4_ = fVar217 * fVar145;
        auVar39._28_4_ = fVar82 + fVar160;
        auVar40._4_4_ = fVar83 * fVar205;
        auVar40._0_4_ = fVar75 * fVar204;
        auVar40._8_4_ = fVar84 * fVar206;
        auVar40._12_4_ = fVar86 * fVar207;
        auVar40._16_4_ = fVar176 * fVar208;
        auVar40._20_4_ = fVar178 * fVar198;
        auVar40._24_4_ = fVar180 * fVar115;
        auVar40._28_4_ = auVar76._28_4_ + auVar101._28_4_;
        auVar76 = vsubps_avx(auVar40,auVar39);
        local_c00._0_4_ = local_c00._4_4_;
        fStack_bf8 = local_c00._4_4_;
        fStack_bf4 = local_c00._4_4_;
        fStack_bf0 = local_c00._4_4_;
        fStack_bec = local_c00._4_4_;
        fStack_be8 = local_c00._4_4_;
        fStack_be4 = local_c00._4_4_;
        auVar92._0_4_ =
             fVar81 * auVar99._0_4_ + local_c00._4_4_ * auVar90._0_4_ + fVar74 * auVar76._0_4_;
        auVar92._4_4_ =
             fVar81 * auVar99._4_4_ + local_c00._4_4_ * auVar90._4_4_ + fVar74 * auVar76._4_4_;
        auVar92._8_4_ =
             fVar81 * auVar99._8_4_ + local_c00._4_4_ * auVar90._8_4_ + fVar74 * auVar76._8_4_;
        auVar92._12_4_ =
             fVar81 * auVar99._12_4_ + local_c00._4_4_ * auVar90._12_4_ + fVar74 * auVar76._12_4_;
        auVar92._16_4_ =
             fVar81 * auVar99._16_4_ + local_c00._4_4_ * auVar90._16_4_ + fVar74 * auVar76._16_4_;
        auVar92._20_4_ =
             fVar81 * auVar99._20_4_ + local_c00._4_4_ * auVar90._20_4_ + fVar74 * auVar76._20_4_;
        auVar92._24_4_ =
             fVar81 * auVar99._24_4_ + local_c00._4_4_ * auVar90._24_4_ + fVar74 * auVar76._24_4_;
        auVar92._28_4_ = auVar99._28_4_ + auVar90._28_4_ + auVar76._28_4_;
        local_ca0._0_4_ = auVar92._0_4_ + (float)local_ce0._0_4_ + fVar183;
        local_ca0._4_4_ = auVar92._4_4_ + (float)local_ce0._4_4_ + fVar192;
        fStack_c98 = auVar92._8_4_ + fVar85 + auVar184._8_4_;
        fStack_c94 = auVar92._12_4_ + fVar173 + auVar184._12_4_;
        fStack_c90 = auVar92._16_4_ + fVar177 + auVar185._16_4_;
        fStack_c8c = auVar92._20_4_ + fVar179 + auVar185._20_4_;
        fStack_c88 = auVar92._24_4_ + fVar181 + auVar188._24_4_;
        fStack_c84 = auVar92._28_4_ + uStack_cc8._4_4_ + auVar188._28_4_;
        auVar99 = vminps_avx(_local_ce0,auVar188);
        auVar99 = vminps_avx(auVar99,auVar92);
        auVar164._8_4_ = 0x7fffffff;
        auVar164._0_8_ = 0x7fffffff7fffffff;
        auVar164._12_4_ = 0x7fffffff;
        auVar164._16_4_ = 0x7fffffff;
        auVar164._20_4_ = 0x7fffffff;
        auVar164._24_4_ = 0x7fffffff;
        auVar164._28_4_ = 0x7fffffff;
        local_a20 = vandps_avx(auVar164,_local_ca0);
        fVar82 = local_a20._0_4_ * 1.1920929e-07;
        fVar199 = local_a20._4_4_ * 1.1920929e-07;
        auVar41._4_4_ = fVar199;
        auVar41._0_4_ = fVar82;
        fVar203 = local_a20._8_4_ * 1.1920929e-07;
        auVar41._8_4_ = fVar203;
        fVar204 = local_a20._12_4_ * 1.1920929e-07;
        auVar41._12_4_ = fVar204;
        fVar205 = local_a20._16_4_ * 1.1920929e-07;
        auVar41._16_4_ = fVar205;
        fVar206 = local_a20._20_4_ * 1.1920929e-07;
        auVar41._20_4_ = fVar206;
        fVar207 = local_a20._24_4_ * 1.1920929e-07;
        auVar41._24_4_ = fVar207;
        auVar41._28_4_ = 0x34000000;
        auVar133._0_8_ = CONCAT44(fVar199,fVar82) ^ 0x8000000080000000;
        auVar133._8_4_ = -fVar203;
        auVar133._12_4_ = -fVar204;
        auVar133._16_4_ = -fVar205;
        auVar133._20_4_ = -fVar206;
        auVar133._24_4_ = -fVar207;
        auVar133._28_4_ = 0xb4000000;
        auVar99 = vcmpps_avx(auVar99,auVar133,5);
        _local_c80 = auVar188;
        auVar101 = _local_c80;
        auVar90 = vmaxps_avx(_local_ce0,auVar188);
        auVar76 = vmaxps_avx(auVar90,auVar92);
        auVar76 = vcmpps_avx(auVar76,auVar41,2);
        auVar99 = vorps_avx(auVar99,auVar76);
        local_c18 = (undefined1 (*) [16])(lVar65 + uVar67 * 0xc + -4);
        auVar22._8_8_ = uStack_a38;
        auVar22._0_8_ = local_a40;
        auVar22._16_8_ = uStack_a30;
        auVar22._24_8_ = uStack_a28;
        auVar22 = auVar22 & auVar99;
        if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar22 >> 0x7f,0) == '\0') &&
              (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar22 >> 0xbf,0) == '\0') &&
            (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar22[0x1f]) {
LAB_00b82fb6:
          auVar149 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar159 = ZEXT1664(local_ad0);
          auVar166 = ZEXT1664(local_ae0);
          auVar175 = ZEXT1664(local_af0);
          auVar190 = ZEXT1664(local_b00);
          auVar202 = ZEXT1664(local_b10);
          auVar211 = ZEXT1664(local_c30);
          auVar222 = ZEXT1664(local_c40);
          auVar232 = ZEXT1664(local_c50);
          auVar241 = ZEXT1664(local_c60);
          auVar139 = ZEXT1664(local_b20);
          goto LAB_00b82262;
        }
        local_bc0 = auVar99;
        auVar42._4_4_ = fVar223 * fVar125;
        auVar42._0_4_ = fVar218 * fVar119;
        auVar42._8_4_ = fVar224 * fVar126;
        auVar42._12_4_ = fVar225 * fVar127;
        auVar42._16_4_ = fVar226 * fVar128;
        auVar42._20_4_ = fVar227 * fVar129;
        auVar42._24_4_ = fVar228 * fVar130;
        auVar42._28_4_ = auVar99._28_4_;
        auVar43._4_4_ = fVar242 * fVar191;
        auVar43._0_4_ = fVar239 * fVar182;
        auVar43._8_4_ = fVar243 * fVar193;
        auVar43._12_4_ = fVar244 * fVar194;
        auVar43._16_4_ = fVar245 * fVar195;
        auVar43._20_4_ = fVar246 * fVar196;
        auVar43._24_4_ = fVar247 * fVar197;
        auVar43._28_4_ = SUB84(uStack_a28,4);
        auVar108 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = fVar242 * fVar212;
        auVar44._0_4_ = fVar239 * fVar209;
        auVar44._8_4_ = fVar243 * fVar213;
        auVar44._12_4_ = fVar244 * fVar214;
        auVar44._16_4_ = fVar245 * fVar215;
        auVar44._20_4_ = fVar246 * fVar216;
        auVar44._24_4_ = fVar247 * fVar217;
        auVar44._28_4_ = 0x34000000;
        auVar45._4_4_ = fVar223 * fVar150;
        auVar45._0_4_ = fVar218 * fVar146;
        auVar45._8_4_ = fVar224 * fVar151;
        auVar45._12_4_ = fVar225 * fVar152;
        auVar45._16_4_ = fVar226 * fVar153;
        auVar45._20_4_ = fVar227 * fVar154;
        auVar45._24_4_ = fVar228 * fVar155;
        auVar45._28_4_ = auVar90._28_4_;
        auVar186 = vsubps_avx(auVar45,auVar44);
        auVar76 = vandps_avx(auVar164,auVar42);
        auVar90 = vandps_avx(auVar164,auVar44);
        auVar76 = vcmpps_avx(auVar76,auVar90,1);
        local_860 = vblendvps_avx(auVar186,auVar108,auVar76);
        auVar46._4_4_ = fVar233 * fVar150;
        auVar46._0_4_ = fVar229 * fVar146;
        auVar46._8_4_ = fVar234 * fVar151;
        auVar46._12_4_ = fVar235 * fVar152;
        auVar46._16_4_ = fVar236 * fVar153;
        auVar46._20_4_ = fVar237 * fVar154;
        auVar46._24_4_ = fVar238 * fVar155;
        auVar46._28_4_ = auVar108._28_4_;
        auVar47._4_4_ = fVar233 * fVar125;
        auVar47._0_4_ = fVar229 * fVar119;
        auVar47._8_4_ = fVar234 * fVar126;
        auVar47._12_4_ = fVar235 * fVar127;
        auVar47._16_4_ = fVar236 * fVar128;
        auVar47._20_4_ = fVar237 * fVar129;
        auVar47._24_4_ = fVar238 * fVar130;
        auVar47._28_4_ = auVar90._28_4_;
        auVar48._4_4_ = fVar167 * fVar242;
        auVar48._0_4_ = fVar161 * fVar239;
        auVar48._8_4_ = fVar168 * fVar243;
        auVar48._12_4_ = fVar169 * fVar244;
        auVar48._16_4_ = fVar170 * fVar245;
        auVar48._20_4_ = fVar171 * fVar246;
        auVar48._24_4_ = fVar172 * fVar247;
        auVar48._28_4_ = auVar186._28_4_;
        auVar108 = vsubps_avx(auVar47,auVar48);
        auVar49._4_4_ = fVar242 * fVar83;
        auVar49._0_4_ = fVar239 * fVar75;
        auVar49._8_4_ = fVar243 * fVar84;
        auVar49._12_4_ = fVar244 * fVar86;
        auVar49._16_4_ = fVar245 * fVar176;
        auVar49._20_4_ = fVar246 * fVar178;
        auVar49._24_4_ = fVar247 * fVar180;
        auVar49._28_4_ = auVar100._28_4_;
        auVar100 = vsubps_avx(auVar49,auVar46);
        auVar76 = vandps_avx(auVar164,auVar48);
        auVar90 = vandps_avx(auVar164,auVar46);
        auVar76 = vcmpps_avx(auVar76,auVar90,1);
        local_840 = vblendvps_avx(auVar100,auVar108,auVar76);
        auVar50._4_4_ = fVar223 * fVar83;
        auVar50._0_4_ = fVar218 * fVar75;
        auVar50._8_4_ = fVar224 * fVar84;
        auVar50._12_4_ = fVar225 * fVar86;
        auVar50._16_4_ = fVar226 * fVar176;
        auVar50._20_4_ = fVar227 * fVar178;
        auVar50._24_4_ = fVar228 * fVar180;
        auVar50._28_4_ = auVar157._28_4_;
        auVar51._4_4_ = fVar167 * fVar223;
        auVar51._0_4_ = fVar161 * fVar218;
        auVar51._8_4_ = fVar168 * fVar224;
        auVar51._12_4_ = fVar169 * fVar225;
        auVar51._16_4_ = fVar170 * fVar226;
        auVar51._20_4_ = fVar171 * fVar227;
        auVar51._24_4_ = fVar172 * fVar228;
        auVar51._28_4_ = auVar76._28_4_;
        auVar52._4_4_ = fVar233 * fVar191;
        auVar52._0_4_ = fVar229 * fVar182;
        auVar52._8_4_ = fVar234 * fVar193;
        auVar52._12_4_ = fVar235 * fVar194;
        auVar52._16_4_ = fVar236 * fVar195;
        auVar52._20_4_ = fVar237 * fVar196;
        auVar52._24_4_ = fVar238 * fVar197;
        auVar52._28_4_ = auVar108._28_4_;
        auVar53._4_4_ = fVar233 * fVar212;
        auVar53._0_4_ = fVar229 * fVar209;
        auVar53._8_4_ = fVar234 * fVar213;
        auVar53._12_4_ = fVar235 * fVar214;
        auVar53._16_4_ = fVar236 * fVar215;
        auVar53._20_4_ = fVar237 * fVar216;
        auVar53._24_4_ = fVar238 * fVar217;
        auVar53._28_4_ = local_9c0._28_4_;
        auVar100 = vsubps_avx(auVar51,auVar52);
        auVar108 = vsubps_avx(auVar53,auVar50);
        auVar76 = vandps_avx(auVar164,auVar52);
        auVar90 = vandps_avx(auVar164,auVar50);
        auVar90 = vcmpps_avx(auVar76,auVar90,1);
        local_820 = vblendvps_avx(auVar108,auVar100,auVar90);
        fVar75 = auVar76._28_4_;
        fVar82 = fVar81 * local_860._0_4_ +
                 local_840._0_4_ * local_c00._4_4_ + local_820._0_4_ * fVar74;
        fVar83 = fVar81 * local_860._4_4_ +
                 local_840._4_4_ * local_c00._4_4_ + local_820._4_4_ * fVar74;
        fVar84 = fVar81 * local_860._8_4_ +
                 local_840._8_4_ * local_c00._4_4_ + local_820._8_4_ * fVar74;
        fVar86 = fVar81 * local_860._12_4_ +
                 local_840._12_4_ * local_c00._4_4_ + local_820._12_4_ * fVar74;
        fVar176 = fVar81 * local_860._16_4_ +
                  local_840._16_4_ * local_c00._4_4_ + local_820._16_4_ * fVar74;
        fVar178 = fVar81 * local_860._20_4_ +
                  local_840._20_4_ * local_c00._4_4_ + local_820._20_4_ * fVar74;
        fVar74 = fVar81 * local_860._24_4_ +
                 local_840._24_4_ * local_c00._4_4_ + local_820._24_4_ * fVar74;
        fVar81 = fVar75 + fVar75 + auVar100._28_4_;
        auVar102._0_4_ = fVar82 + fVar82;
        auVar102._4_4_ = fVar83 + fVar83;
        auVar102._8_4_ = fVar84 + fVar84;
        auVar102._12_4_ = fVar86 + fVar86;
        auVar102._16_4_ = fVar176 + fVar176;
        auVar102._20_4_ = fVar178 + fVar178;
        auVar102._24_4_ = fVar74 + fVar74;
        auVar102._28_4_ = fVar81 + fVar81;
        fVar82 = auVar108._28_4_;
        auVar76 = vrcpps_avx(auVar102);
        fVar83 = local_860._0_4_ * fVar10 + local_840._0_4_ * fVar8 + local_820._0_4_ * fVar9;
        fVar110 = local_860._4_4_ * fVar110 + local_840._4_4_ * fVar11 + local_820._4_4_ * fVar12;
        fVar111 = local_860._8_4_ * fVar113 + local_840._8_4_ * fVar111 + local_820._8_4_ * fVar112;
        fVar112 = local_860._12_4_ * fVar118 +
                  local_840._12_4_ * fVar114 + local_820._12_4_ * fVar116;
        fVar113 = local_860._16_4_ * fVar15 + local_840._16_4_ * fVar13 + local_820._16_4_ * fVar14;
        fVar114 = local_860._20_4_ * fVar18 + local_840._20_4_ * fVar16 + local_820._20_4_ * fVar17;
        fVar116 = local_860._24_4_ * fVar21 + local_840._24_4_ * fVar19 + local_820._24_4_ * fVar20;
        fVar118 = fVar82 + fVar82 + fVar75;
        fVar74 = auVar76._0_4_;
        fVar81 = auVar76._4_4_;
        auVar54._4_4_ = auVar102._4_4_ * fVar81;
        auVar54._0_4_ = auVar102._0_4_ * fVar74;
        fVar8 = auVar76._8_4_;
        auVar54._8_4_ = auVar102._8_4_ * fVar8;
        fVar9 = auVar76._12_4_;
        auVar54._12_4_ = auVar102._12_4_ * fVar9;
        fVar10 = auVar76._16_4_;
        auVar54._16_4_ = auVar102._16_4_ * fVar10;
        fVar11 = auVar76._20_4_;
        auVar54._20_4_ = auVar102._20_4_ * fVar11;
        fVar12 = auVar76._24_4_;
        auVar54._24_4_ = auVar102._24_4_ * fVar12;
        auVar54._28_4_ = fVar82;
        auVar147._8_4_ = 0x3f800000;
        auVar147._0_8_ = 0x3f8000003f800000;
        auVar147._12_4_ = 0x3f800000;
        auVar147._16_4_ = 0x3f800000;
        auVar147._20_4_ = 0x3f800000;
        auVar147._24_4_ = 0x3f800000;
        auVar147._28_4_ = 0x3f800000;
        auVar76 = vsubps_avx(auVar147,auVar54);
        uVar60 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
        auVar134._4_4_ = uVar60;
        auVar134._0_4_ = uVar60;
        auVar134._8_4_ = uVar60;
        auVar134._12_4_ = uVar60;
        auVar134._16_4_ = uVar60;
        auVar134._20_4_ = uVar60;
        auVar134._24_4_ = uVar60;
        auVar134._28_4_ = uVar60;
        local_880._4_4_ = (fVar110 + fVar110) * (fVar81 + fVar81 * auVar76._4_4_);
        local_880._0_4_ = (fVar83 + fVar83) * (fVar74 + fVar74 * auVar76._0_4_);
        local_880._8_4_ = (fVar111 + fVar111) * (fVar8 + fVar8 * auVar76._8_4_);
        local_880._12_4_ = (fVar112 + fVar112) * (fVar9 + fVar9 * auVar76._12_4_);
        local_880._16_4_ = (fVar113 + fVar113) * (fVar10 + fVar10 * auVar76._16_4_);
        local_880._20_4_ = (fVar114 + fVar114) * (fVar11 + fVar11 * auVar76._20_4_);
        local_880._24_4_ = (fVar116 + fVar116) * (fVar12 + fVar12 * auVar76._24_4_);
        local_880._28_4_ = fVar118 + fVar118;
        auVar76 = vcmpps_avx(auVar134,local_880,2);
        fVar74 = ray->tfar;
        auVar135._4_4_ = fVar74;
        auVar135._0_4_ = fVar74;
        auVar135._8_4_ = fVar74;
        auVar135._12_4_ = fVar74;
        auVar135._16_4_ = fVar74;
        auVar135._20_4_ = fVar74;
        auVar135._24_4_ = fVar74;
        auVar135._28_4_ = fVar74;
        auVar90 = vcmpps_avx(local_880,auVar135,2);
        auVar76 = vandps_avx(auVar76,auVar90);
        auVar90 = vcmpps_avx(auVar102,_DAT_01f7b000,4);
        auVar76 = vandps_avx(auVar90,auVar76);
        auVar89 = vpslld_avx(auVar76._0_16_,0x1f);
        auVar124 = vpsrad_avx(auVar89,0x1f);
        auVar89 = vpslld_avx(auVar76._16_16_,0x1f);
        auVar89 = vpsrad_avx(auVar89,0x1f);
        auVar103._16_16_ = auVar89;
        auVar103._0_16_ = auVar124;
        auVar58._8_8_ = uStack_a38;
        auVar58._0_8_ = local_a40;
        auVar58._16_8_ = uStack_a30;
        auVar58._24_8_ = uStack_a28;
        auVar99 = vandps_avx(auVar58,auVar99);
        auVar76 = auVar99 & auVar103;
        if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar76 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar76 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar76 >> 0x7f,0) == '\0') &&
              (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar76 >> 0xbf,0) == '\0') &&
            (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar76[0x1f]) goto LAB_00b82fb6;
        uVar67 = CONCAT44(0,*(uint *)(local_ca8 + 0x18));
        auVar5._0_4_ = ray->tfar;
        auVar5._4_4_ = ray->mask;
        auVar5._8_4_ = ray->id;
        auVar5._12_4_ = ray->flags;
        local_8e0 = vandps_avx(auVar103,auVar99);
        uVar63 = vextractps_avx(auVar5,1);
        uStack_cd0 = auVar59._16_8_;
        uStack_cc8 = auVar219._24_8_;
        local_960 = local_ce0;
        uStack_958 = uStack_cd8;
        uStack_950 = uStack_cd0;
        uStack_948 = uStack_cc8;
        uStack_c78 = auVar184._8_8_;
        uStack_c70 = auVar185._16_8_;
        uStack_c68 = auVar188._24_8_;
        local_940 = auVar184._0_8_;
        uStack_938 = uStack_c78;
        uStack_930 = uStack_c70;
        uStack_928 = uStack_c68;
        local_920 = _local_ca0;
        local_900 = &local_c18;
        pGVar7 = (context->scene->geometries).items[uVar67].ptr;
        if ((pGVar7->mask & uVar63) == 0) goto LAB_00b82fb6;
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00b83177;
        local_be0 = (undefined1  [8])context->args;
        local_c00 = (long)pGVar7;
        auVar89 = *(undefined1 (*) [16])(*local_c18 + local_c10 * 4);
        auVar124 = auVar89;
        if (2 < local_c08) {
          auVar124 = *(undefined1 (*) [16])(*local_c18 + local_c10 * 8);
        }
        local_ac0._0_16_ = auVar5;
        auVar99 = vrcpps_avx(_local_ca0);
        fVar74 = auVar99._0_4_;
        fVar81 = auVar99._4_4_;
        auVar55._4_4_ = (float)local_ca0._4_4_ * fVar81;
        auVar55._0_4_ = (float)local_ca0._0_4_ * fVar74;
        fVar8 = auVar99._8_4_;
        auVar55._8_4_ = fStack_c98 * fVar8;
        fVar9 = auVar99._12_4_;
        auVar55._12_4_ = fStack_c94 * fVar9;
        fVar10 = auVar99._16_4_;
        auVar55._16_4_ = fStack_c90 * fVar10;
        fVar11 = auVar99._20_4_;
        auVar55._20_4_ = fStack_c8c * fVar11;
        fVar12 = auVar99._24_4_;
        auVar55._24_4_ = fStack_c88 * fVar12;
        auVar55._28_4_ = fStack_c84;
        auVar136._8_4_ = 0x3f800000;
        auVar136._0_8_ = 0x3f8000003f800000;
        auVar136._12_4_ = 0x3f800000;
        auVar136._16_4_ = 0x3f800000;
        auVar136._20_4_ = 0x3f800000;
        auVar136._24_4_ = 0x3f800000;
        auVar136._28_4_ = 0x3f800000;
        auVar76 = vsubps_avx(auVar136,auVar55);
        auVar78._0_4_ = fVar74 + fVar74 * auVar76._0_4_;
        auVar78._4_4_ = fVar81 + fVar81 * auVar76._4_4_;
        auVar78._8_4_ = fVar8 + fVar8 * auVar76._8_4_;
        auVar78._12_4_ = fVar9 + fVar9 * auVar76._12_4_;
        auVar78._16_4_ = fVar10 + fVar10 * auVar76._16_4_;
        auVar78._20_4_ = fVar11 + fVar11 * auVar76._20_4_;
        auVar78._24_4_ = fVar12 + fVar12 * auVar76._24_4_;
        auVar78._28_4_ = auVar99._28_4_ + auVar76._28_4_;
        auVar93._8_4_ = 0x219392ef;
        auVar93._0_8_ = 0x219392ef219392ef;
        auVar93._12_4_ = 0x219392ef;
        auVar93._16_4_ = 0x219392ef;
        auVar93._20_4_ = 0x219392ef;
        auVar93._24_4_ = 0x219392ef;
        auVar93._28_4_ = 0x219392ef;
        auVar99 = vcmpps_avx(local_a20,auVar93,5);
        auVar99 = vandps_avx(auVar99,auVar78);
        auVar56._4_4_ = auVar99._4_4_ * (float)local_ce0._4_4_;
        auVar56._0_4_ = auVar99._0_4_ * (float)local_ce0._0_4_;
        auVar56._8_4_ = auVar99._8_4_ * fVar85;
        auVar56._12_4_ = auVar99._12_4_ * fVar173;
        auVar56._16_4_ = auVar99._16_4_ * fVar177;
        auVar56._20_4_ = auVar99._20_4_ * fVar179;
        auVar56._24_4_ = auVar99._24_4_ * fVar181;
        auVar56._28_4_ = auVar78._28_4_;
        _local_ce0 = vminps_avx(auVar56,auVar136);
        auVar57._4_4_ = auVar99._4_4_ * fVar192;
        auVar57._0_4_ = auVar99._0_4_ * fVar183;
        auVar57._8_4_ = auVar99._8_4_ * auVar184._8_4_;
        auVar57._12_4_ = auVar99._12_4_ * auVar184._12_4_;
        auVar57._16_4_ = auVar99._16_4_ * auVar185._16_4_;
        auVar57._20_4_ = auVar99._20_4_ * auVar185._20_4_;
        auVar57._24_4_ = auVar99._24_4_ * auVar188._24_4_;
        auVar57._28_4_ = auVar99._28_4_;
        auVar99 = vminps_avx(auVar57,auVar136);
        auVar156 = *local_c18;
        if (local_c10 == 2) {
          auVar156 = vpshufd_avx(auVar156,0x54);
          auVar89 = vpshufd_avx(auVar89,0x54);
          auVar124 = vpshufd_avx(auVar124,0x54);
        }
        auVar148._16_16_ = auVar89;
        auVar148._0_16_ = auVar156;
        auVar158._16_16_ = auVar124;
        auVar158._0_16_ = auVar89;
        auVar76 = vunpcklps_avx(auVar148,auVar158);
        auVar156 = vpshufd_avx(auVar156,0xa5);
        auVar94 = vpshufd_avx(auVar89,0xa5);
        auVar165._16_16_ = auVar94;
        auVar165._0_16_ = auVar156;
        auVar89 = vpshufd_avx(auVar89,0x94);
        auVar124 = vpshufd_avx(auVar124,0x94);
        local_bc0._16_16_ = auVar124;
        local_bc0._0_16_ = auVar89;
        auVar189._0_16_ = vpsrld_avx(auVar76._0_16_,0x10);
        auVar200 = vpsrld_avx(auVar76._16_16_,0x10);
        auVar79._8_4_ = 0xffff;
        auVar79._0_8_ = 0xffff0000ffff;
        auVar79._12_4_ = 0xffff;
        auVar79._16_4_ = 0xffff;
        auVar79._20_4_ = 0xffff;
        auVar79._24_4_ = 0xffff;
        auVar79._28_4_ = 0xffff;
        auVar76 = vandps_avx(auVar76,auVar79);
        auVar90 = vcvtdq2ps_avx(auVar76);
        auVar189._16_16_ = auVar200;
        auVar100 = vcvtdq2ps_avx(auVar189);
        auVar137._0_16_ = vpsrld_avx(auVar156,0x10);
        auVar156 = vpsrld_avx(auVar94,0x10);
        auVar76 = vandps_avx(auVar165,auVar79);
        auVar108 = vcvtdq2ps_avx(auVar76);
        auVar137._16_16_ = auVar156;
        auVar157 = vcvtdq2ps_avx(auVar137);
        auVar109._0_16_ = vpsrld_avx(auVar89,0x10);
        auVar89 = vpsrld_avx(auVar124,0x10);
        auVar76 = vandps_avx(auVar79,local_bc0);
        auVar76 = vcvtdq2ps_avx(auVar76);
        auVar109._16_16_ = auVar89;
        auVar186 = vcvtdq2ps_avx(auVar109);
        auVar138._8_4_ = 0x3f800000;
        auVar138._0_8_ = 0x3f8000003f800000;
        auVar138._12_4_ = 0x3f800000;
        auVar138._16_4_ = 0x3f800000;
        auVar138._20_4_ = 0x3f800000;
        auVar138._24_4_ = 0x3f800000;
        auVar138._28_4_ = 0x3f800000;
        auVar162 = vsubps_avx(auVar138,_local_ce0);
        auVar162 = vsubps_avx(auVar162,auVar99);
        local_8c0[0] = auVar99._0_4_ * auVar76._0_4_ * 0.00012207031 +
                       auVar108._0_4_ * 0.00012207031 * local_ce0._0_4_ +
                       auVar162._0_4_ * auVar90._0_4_ * 0.00012207031;
        local_8c0[1] = auVar99._4_4_ * auVar76._4_4_ * 0.00012207031 +
                       auVar108._4_4_ * 0.00012207031 * local_ce0._4_4_ +
                       auVar162._4_4_ * auVar90._4_4_ * 0.00012207031;
        local_8c0[2] = auVar99._8_4_ * auVar76._8_4_ * 0.00012207031 +
                       auVar108._8_4_ * 0.00012207031 * local_ce0._8_4_ +
                       auVar162._8_4_ * auVar90._8_4_ * 0.00012207031;
        local_8c0[3] = auVar99._12_4_ * auVar76._12_4_ * 0.00012207031 +
                       auVar108._12_4_ * 0.00012207031 * local_ce0._12_4_ +
                       auVar162._12_4_ * auVar90._12_4_ * 0.00012207031;
        fStack_8b0 = auVar99._16_4_ * auVar76._16_4_ * 0.00012207031 +
                     auVar108._16_4_ * 0.00012207031 * local_ce0._16_4_ +
                     auVar162._16_4_ * auVar90._16_4_ * 0.00012207031;
        fStack_8ac = auVar99._20_4_ * auVar76._20_4_ * 0.00012207031 +
                     auVar108._20_4_ * 0.00012207031 * local_ce0._20_4_ +
                     auVar162._20_4_ * auVar90._20_4_ * 0.00012207031;
        fStack_8a8 = auVar99._24_4_ * auVar76._24_4_ * 0.00012207031 +
                     auVar108._24_4_ * 0.00012207031 * local_ce0._24_4_ +
                     auVar162._24_4_ * auVar90._24_4_ * 0.00012207031;
        fStack_8a4 = auVar76._28_4_ + 0.0 + auVar99._28_4_;
        local_8a0[0] = auVar99._0_4_ * auVar186._0_4_ * 0.00012207031 +
                       local_ce0._0_4_ * auVar157._0_4_ * 0.00012207031 +
                       auVar100._0_4_ * 0.00012207031 * auVar162._0_4_;
        local_8a0[1] = auVar99._4_4_ * auVar186._4_4_ * 0.00012207031 +
                       local_ce0._4_4_ * auVar157._4_4_ * 0.00012207031 +
                       auVar100._4_4_ * 0.00012207031 * auVar162._4_4_;
        local_8a0[2] = auVar99._8_4_ * auVar186._8_4_ * 0.00012207031 +
                       local_ce0._8_4_ * auVar157._8_4_ * 0.00012207031 +
                       auVar100._8_4_ * 0.00012207031 * auVar162._8_4_;
        local_8a0[3] = auVar99._12_4_ * auVar186._12_4_ * 0.00012207031 +
                       local_ce0._12_4_ * auVar157._12_4_ * 0.00012207031 +
                       auVar100._12_4_ * 0.00012207031 * auVar162._12_4_;
        fStack_890 = auVar99._16_4_ * auVar186._16_4_ * 0.00012207031 +
                     local_ce0._16_4_ * auVar157._16_4_ * 0.00012207031 +
                     auVar100._16_4_ * 0.00012207031 * auVar162._16_4_;
        fStack_88c = auVar99._20_4_ * auVar186._20_4_ * 0.00012207031 +
                     local_ce0._20_4_ * auVar157._20_4_ * 0.00012207031 +
                     auVar100._20_4_ * 0.00012207031 * auVar162._20_4_;
        fStack_888 = auVar99._24_4_ * auVar186._24_4_ * 0.00012207031 +
                     local_ce0._24_4_ * auVar157._24_4_ * 0.00012207031 +
                     auVar100._24_4_ * 0.00012207031 * auVar162._24_4_;
        fStack_884 = auVar186._28_4_ + auVar157._28_4_ + auVar162._28_4_;
        uVar60 = vmovmskps_avx(local_8e0);
        uVar62 = CONCAT44((int)((ulong)local_c18 >> 0x20),uVar60);
        lVar65 = 0;
        if (uVar62 != 0) {
          for (; (uVar62 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
          }
        }
        local_a80._0_8_ = uVar67;
        local_aa0._0_4_ = *(undefined4 *)(local_ca8 + 0x1c);
        local_b6c = *(undefined4 *)(local_ca8 + 0x1c);
        _local_c80 = auVar101;
        local_9c0 = auVar23;
        while( true ) {
          auVar241 = ZEXT1664(local_c60);
          auVar232 = ZEXT1664(local_c50);
          auVar222 = ZEXT1664(local_c40);
          auVar211 = ZEXT1664(local_c30);
          if (uVar62 == 0) break;
          local_ce0 = (undefined1  [8])uVar62;
          local_b74 = local_8c0[lVar65];
          local_b70 = local_8a0[lVar65];
          ray->tfar = *(float *)(local_880 + lVar65 * 4);
          local_b40 = context->user;
          local_b80 = *(undefined4 *)(local_860 + lVar65 * 4);
          local_b7c = *(undefined4 *)(local_840 + lVar65 * 4);
          local_bc0._0_8_ = lVar65;
          local_b78 = *(undefined4 *)(local_820 + lVar65 * 4);
          local_b68 = (undefined4)uVar67;
          local_b64 = local_b40->instID[0];
          local_b60 = local_b40->instPrimID[0];
          local_ce4 = -1;
          local_b50 = &local_ce4;
          local_b48 = *(undefined8 *)(local_c00 + 0x18);
          local_b30 = &local_b80;
          local_b28 = 1;
          local_b38 = ray;
          if ((*(code **)(local_c00 + 0x48) == (code *)0x0) ||
             ((**(code **)(local_c00 + 0x48))(&local_b50), *local_b50 != 0)) {
            if ((*(code **)((long)local_be0 + 0x10) == (code *)0x0) ||
               ((((*(byte *)local_be0 & 2) == 0 && ((*(byte *)(local_c00 + 0x3e) & 0x40) == 0)) ||
                ((**(code **)((long)local_be0 + 0x10))(&local_b50), *local_b50 != 0)))) {
LAB_00b83177:
              ray->tfar = -INFINITY;
              return;
            }
          }
          ray->tfar = (float)local_ac0._0_4_;
          uVar62 = (ulong)local_ce0 ^ 1L << (local_bc0._0_8_ & 0x3f);
          lVar65 = 0;
          if (uVar62 != 0) {
            for (; (uVar62 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
            }
          }
          uVar67 = local_a80._0_8_;
          local_b6c = local_aa0._0_4_;
        }
        auVar149 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar159 = ZEXT1664(local_ad0);
        auVar166 = ZEXT1664(local_ae0);
        auVar175 = ZEXT1664(local_af0);
        auVar190 = ZEXT1664(local_b00);
        auVar202 = ZEXT1664(local_b10);
        auVar139 = ZEXT1664(local_b20);
      } while( true );
    }
  }
  return;
LAB_00b823b9:
  do {
    *local_cb0 = uVar67;
    local_cb0 = local_cb0 + 1;
    lVar65 = 0;
    if (uVar64 != 0) {
      for (; (uVar64 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
      }
    }
    uVar67 = *(ulong *)(uVar62 + lVar65 * 8);
    uVar64 = uVar64 - 1 & uVar64;
  } while (uVar64 != 0);
  goto LAB_00b82273;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }